

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

bool __thiscall
mp::internal::TextReader<fmt::Locale>::ReadIntWithoutSign<unsigned_long>
          (TextReader<fmt::Locale> *this,unsigned_long *value)

{
  long lVar1;
  CStringRef arg0;
  CStringRef arg0_00;
  undefined8 *in_RSI;
  long *in_RDI;
  UInt max;
  UInt new_result;
  UInt result;
  char c;
  bool local_51;
  BasicCStringRef<char> local_48;
  TextReader<fmt::Locale> *local_40;
  BasicCStringRef<char> local_38;
  TextReader<fmt::Locale> *local_30;
  TextReader<fmt::Locale> *pTVar2;
  undefined7 in_stack_ffffffffffffffe0;
  char cVar3;
  bool local_1;
  
  cVar3 = *(char *)*in_RDI;
  if ((cVar3 < '0') || ('9' < cVar3)) {
    local_1 = false;
  }
  else {
    pTVar2 = (TextReader<fmt::Locale> *)0x0;
    do {
      local_30 = (TextReader<fmt::Locale> *)((long)pTVar2 * 10 + (long)(cVar3 + -0x30));
      if (local_30 < pTVar2) {
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_38,"number is too big");
        arg0.data_._7_1_ = cVar3;
        arg0.data_._0_7_ = in_stack_ffffffffffffffe0;
        ReportError<>(pTVar2,arg0);
      }
      lVar1 = *in_RDI;
      *in_RDI = lVar1 + 1;
      cVar3 = *(char *)(lVar1 + 1);
      local_51 = '/' < cVar3 && cVar3 < ':';
      pTVar2 = local_30;
    } while (local_51);
    local_40 = (TextReader<fmt::Locale> *)std::numeric_limits<unsigned_long>::max();
    if (local_40 < pTVar2) {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_48,"number is too big");
      arg0_00.data_._7_1_ = cVar3;
      arg0_00.data_._0_7_ = in_stack_ffffffffffffffe0;
      ReportError<>(pTVar2,arg0_00);
    }
    *in_RSI = pTVar2;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ReadIntWithoutSign(Int& value) {
    char c = *ptr_;
    if (c < '0' || c > '9')
      return false;
    typedef typename MakeUnsigned<Int>::Type UInt;
    UInt result = 0;
    do {
      UInt new_result = result * 10 + (c - '0');
      if (new_result < result)
        ReportError("number is too big");
      result = new_result;
      c = *++ptr_;
    } while (c >= '0' && c <= '9');
    UInt max = std::numeric_limits<Int>::max();
    if (result > max)
      ReportError("number is too big");
    value = result;
    return true;
  }